

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stream.cpp
# Opt level: O2

int __thiscall
boost::deflate::deflate_stream_test::ZlibCompressor::init(ZlibCompressor *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  invalid_argument *this_00;
  
  deflateEnd(&this->zs);
  (this->zs).next_in = (Bytef *)0x0;
  *(undefined8 *)&(this->zs).avail_in = 0;
  (this->zs).total_in = 0;
  (this->zs).next_out = (Bytef *)0x0;
  *(undefined8 *)&(this->zs).avail_out = 0;
  (this->zs).total_out = 0;
  (this->zs).msg = (char *)0x0;
  (this->zs).state = (internal_state *)0x0;
  (this->zs).zalloc = (alloc_func)0x0;
  (this->zs).zfree = (free_func)0x0;
  (this->zs).opaque = (voidpf)0x0;
  *(undefined8 *)&(this->zs).data_type = 0;
  (this->zs).adler = 0;
  (this->zs).reserved = 0;
  iVar1 = deflateInit2_(&this->zs,-1,8,-0xf,8,0,"1.2.11",0x70);
  if (iVar1 == 0) {
    return 0;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"zlib compressor: failure");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void init() override {
            deflateEnd(&zs);
            zs = {};
            const auto res = deflateInit2(&zs, -1, Z_DEFLATED, -15, 8, Z_DEFAULT_STRATEGY);
            if(res != Z_OK)
               throw std::invalid_argument{"zlib compressor: failure"};
        }